

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O3

string * __thiscall
HDD::GetIdentifyString_abi_cxx11_(string *__return_storage_ptr__,HDD *this,void *p,size_t n)

{
  char cVar1;
  pointer pcVar2;
  ulong uVar3;
  ulong uVar4;
  string local_38;
  
  uVar4 = n & 0xfffffffffffffffe;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,p,(long)p + uVar4);
  if (uVar4 != 0) {
    uVar3 = 0;
    do {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      cVar1 = pcVar2[uVar3];
      pcVar2[uVar3] = pcVar2[uVar3 + 1];
      pcVar2[uVar3 + 1] = cVar1;
      uVar3 = uVar3 + 2;
    } while (uVar3 < uVar4);
  }
  util::trim(&local_38,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string HDD::GetIdentifyString(void* p, size_t n)
{
    // Buffer length must be even
    n &= ~1;

    auto pcsz = reinterpret_cast<const char*>(p);
    std::string s(pcsz, n);

    // Copy the string, up to the size of the buffer
    for (size_t i = 0; i < n; i += 2)
        std::swap(s[i], s[i + 1]);

    // Trim leading and trailing spaces
    s = util::trim(s);

    return s;
}